

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderConnectionWarning(CHud *this)

{
  IGraphics *pIVar1;
  ITextRender *pIVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface)._vptr_IInterface
            [0x28])();
  if ((char)iVar3 != '\0') {
    pcVar4 = Localize("Connection Problems...","");
    if (RenderConnectionWarning()::s_Cursor == '\0') {
      iVar3 = __cxa_guard_acquire(&RenderConnectionWarning()::s_Cursor);
      if (iVar3 != 0) {
        CTextCursor::CTextCursor(&RenderConnectionWarning::s_Cursor,24.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderConnectionWarning::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderConnectionWarning()::s_Cursor);
      }
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderConnectionWarning::s_Cursor.m_CursorPos.field_0.x =
         ((float)pIVar1->m_ScreenWidth / (float)pIVar1->m_ScreenHeight) * 150.0;
    RenderConnectionWarning::s_Cursor.m_CursorPos.field_1.y = 50.0;
    RenderConnectionWarning::s_Cursor.m_Align = 1;
    CTextCursor::Reset(&RenderConnectionWarning::s_Cursor,(long)g_Localization.m_CurrentVersion);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderConnectionWarning::s_Cursor,pcVar4,0xffffffffffffffff);
    return;
  }
  return;
}

Assistant:

void CHud::RenderConnectionWarning()
{
	if(Client()->ConnectionProblems())
	{
		const char *pText = Localize("Connection Problems...");
		static CTextCursor s_Cursor(24.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 50.0f);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
	}
}